

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O1

void __thiscall DataSet::load(DataSet *this,string *filepath,ReadInfo *info)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar1;
  iterator __position;
  _Alloc_hider _Var2;
  char cVar3;
  char cVar4;
  int *piVar5;
  long lVar6;
  istream *piVar7;
  vector<double,_std::allocator<double>_> *this_01;
  undefined8 uVar8;
  uint uVar9;
  pointer pcVar10;
  string token;
  string line;
  stringstream stream_1;
  stringstream stream;
  ifstream file;
  uint local_5b8;
  int local_5b4;
  DataSet *local_5b0;
  ReadInfo *local_5a8;
  Matrix<double> *local_5a0;
  pointer local_598;
  value_type local_590;
  char *local_570;
  long local_568;
  char local_560;
  undefined7 uStack_55f;
  long local_550;
  char *local_548;
  undefined8 local_540;
  char local_538;
  undefined7 uStack_537;
  ios_base local_4c8 [264];
  long local_3c0 [2];
  ostream local_3b0 [8];
  string local_3a8 [104];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_5b0 = this;
  local_5a8 = info;
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  local_570 = &local_560;
  local_568 = 0;
  local_560 = '\0';
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590._M_string_length = 0;
  local_590.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream((istream *)local_238,(string *)filepath,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [loading file]: Couldn\'t open up the file!\n");
LAB_0010307d:
    exit(1);
  }
  lVar6 = 0;
  local_550 = 0;
  if (local_5a8->shape_skip != false) {
LAB_00102cdf:
    cVar3 = (char)(istream *)local_238;
    if (local_5a8->header_skip == false) {
      cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar3);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_238,(string *)&local_570,cVar4);
      std::__cxx11::stringstream::stringstream
                ((stringstream *)&local_548,(string *)&local_570,_S_out|_S_in);
      this_00 = &local_5b0->m_labels;
      while (piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&local_548,(string *)&local_590,','),
            ((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&local_590);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&local_548);
      std::ios_base::~ios_base(local_4c8);
    }
    local_5a0 = &local_5b0->m_matrix;
    local_5b8 = 0;
    do {
      do {
        cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar3);
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_570,cVar4);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
          if ((uint)local_550 != local_5b8 && (uint)local_550 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"WARNING [loading file]: Shape doesn\'t match!\n",0x2d)
            ;
          }
          std::ifstream::close();
          std::ifstream::~ifstream(local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p,
                            CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                                     local_590.field_2._M_local_buf[0]) + 1);
          }
          if (local_570 != &local_560) {
            operator_delete(local_570,CONCAT71(uStack_55f,local_560) + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
          std::ios_base::~ios_base(local_340);
          return;
        }
      } while ((local_568 == 0) && (local_5a8->empty_line_skip != false));
      std::__ostream_insert<char,std::char_traits<char>>(local_3b0,local_570,local_568);
      Matrix<double>::add_row(local_5a0,1);
      uVar9 = 0;
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_3c0,(string *)&local_590,',');
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
        this_01 = Matrix<double>::operator[](local_5a0,local_5b8);
        _Var2._M_p = local_590._M_dataplus._M_p;
        piVar5 = __errno_location();
        local_5b4 = *piVar5;
        *piVar5 = 0;
        pcVar10 = (pointer)strtod(_Var2._M_p,&local_548);
        if (local_548 == _Var2._M_p) {
          std::__throw_invalid_argument("stod");
LAB_00103049:
          std::__throw_out_of_range("stod");
          goto LAB_00103055;
        }
        if (*piVar5 == 0) {
          *piVar5 = local_5b4;
        }
        else if (*piVar5 == 0x22) goto LAB_00103049;
        __position._M_current =
             (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_598 = pcVar10;
        if (__position._M_current ==
            (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (this_01,__position,(double *)&local_598);
        }
        else {
          *__position._M_current = (double)pcVar10;
          (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar9 = uVar9 + 1;
      }
      if (((uint)lVar6 != uVar9 && (uint)lVar6 != 0) ||
         ((local_5b8 != 0 && ((local_5a0->m_shape).n_col != uVar9)))) {
LAB_00103055:
        std::operator<<((ostream *)&std::cout,"ERROR [file loading]: Different dimensions!\n");
        goto LAB_0010307d;
      }
      (local_5b0->m_matrix).m_shape.n_col = uVar9;
      local_540 = 0;
      local_538 = '\0';
      local_548 = &local_538;
      std::__cxx11::stringbuf::str(local_3a8);
      if (local_548 != &local_538) {
        operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
      }
      local_5b8 = local_5b8 + 1;
      std::ios::clear((int)*(undefined8 *)(local_3c0[0] + -0x18) + (int)local_3c0);
    } while( true );
  }
  cVar3 = std::ios::widen((char)&local_5b8 + (char)*(long *)(local_238[0] + -0x18) + -0x80);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_570,cVar3);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&local_548,(string *)&local_570,_S_out|_S_in);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&local_548,(string *)&local_590,',');
  _Var2._M_p = local_590._M_dataplus._M_p;
  piVar5 = __errno_location();
  iVar1 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(_Var2._M_p,&local_598,10);
  if (local_598 == _Var2._M_p) {
    std::__throw_invalid_argument("stoi");
LAB_00103093:
    std::__throw_out_of_range("stoi");
  }
  else {
    local_550 = lVar6;
    if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_00103093;
    if (*piVar5 == 0) {
      *piVar5 = iVar1;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_548,(string *)&local_590,',');
    _Var2._M_p = local_590._M_dataplus._M_p;
    iVar1 = *piVar5;
    *piVar5 = 0;
    lVar6 = strtol(local_590._M_dataplus._M_p,&local_598,10);
    if (local_598 != _Var2._M_p) {
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_548);
        std::ios_base::~ios_base(local_4c8);
        goto LAB_00102cdf;
      }
      goto LAB_001030ab;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_001030ab:
  uVar8 = std::__throw_out_of_range("stoi");
  std::ifstream::~ifstream(local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT71(local_590.field_2._M_allocated_capacity._1_7_,
                             local_590.field_2._M_local_buf[0]) + 1);
  }
  if (local_570 != &local_560) {
    operator_delete(local_570,CONCAT71(uStack_55f,local_560) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  _Unwind_Resume(uVar8);
}

Assistant:

void DataSet::load(const std::string& filepath, const ReadInfo& info){
    unsigned n_row=0, n_col=0;
    Shape shape;
    
    std::stringstream stream;
    std::string line, token;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [loading file]: Couldn't open up the file!\n";
        exit(1);
    }

    if(!info.shape_skip){
        std::getline(file, line);
        std::stringstream stream(line);

        std::getline(stream, token, ',');
        shape.n_row=std::stoi(token);
        std::getline(stream, token, ',');
        shape.n_col=std::stoi(token);
    }
    if(!info.header_skip){
        std::getline(file, line);
        std::stringstream stream(line);
        while(std::getline(stream, token, ',')){
            m_labels.push_back(token);
        }
    }

    while(std::getline(file, line)){
        if(line.empty() && info.empty_line_skip) continue;

        stream<<line;
        m_matrix.add_row();
        while(std::getline(stream, token, ',')){
            m_matrix[n_row].push_back(std::stod(token));
            ++n_col;
        }

        if( (shape.n_col && shape.n_col!=n_col) || 
            (n_row && n_col!=m_matrix.shape().n_col) ){
            std::cout<<"ERROR [file loading]: Different dimensions!\n";
            exit(1);
        }

        m_matrix.set_shape(m_matrix.shape().n_row, n_col);
        n_col=0; ++n_row;
        stream.str(std::string());
        stream.clear();
    }

    if(shape.n_row && shape.n_row!=n_row){
        std::cout<<"WARNING [loading file]: Shape doesn't match!\n";
    }

    file.close();
}